

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

void __thiscall VertexClustering::~VertexClustering(VertexClustering *this)

{
  VertexGroup *pVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  ulong uVar4;
  
  ppVVar2 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar3 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar3 != ppVVar2) {
    uVar4 = 0;
    do {
      if (ppVVar2[uVar4] != (VCCluster *)0x0) {
        (*ppVVar2[uVar4]->_vptr_VCCluster[3])();
        ppVVar2 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppVVar3 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppVVar3 - (long)ppVVar2 >> 3));
  }
  pVVar1 = this->vGroup;
  if (pVVar1 != (VertexGroup *)0x0) {
    VertexGroup::~VertexGroup(pVVar1);
  }
  operator_delete(pVVar1);
  pVVar1 = this->vGroupNew;
  if (pVVar1 != (VertexGroup *)0x0) {
    VertexGroup::~VertexGroup(pVVar1);
    operator_delete(pVVar1);
  }
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::~_Deque_base
            ((_Deque_base<VCEdge,_std::allocator<VCEdge>_> *)&this->boundary);
  std::
  _Rb_tree<VCPair,_std::pair<const_VCPair,_VCEdge>,_std::_Select1st<std::pair<const_VCPair,_VCEdge>_>,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
  ::~_Rb_tree(&(this->edgeMap)._M_t);
  ppVVar2 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2);
    return;
  }
  return;
}

Assistant:

VertexClustering::~VertexClustering(void)
{
	for (int i = 0; i < clusters.size(); i++)
		delete clusters[i];
	delete vGroup;
	if (vGroupNew)
		delete vGroupNew;
}